

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O1

void mg_set_handler_type(mg_context *phys_ctx,mg_domain_context *dom_ctx,char *uri,int handler_type,
                        int is_delete_request,mg_request_handler handler,
                        mg_websocket_subprotocols *subprotocols,
                        mg_websocket_connect_handler connect_handler,
                        mg_websocket_ready_handler ready_handler,
                        mg_websocket_data_handler data_handler,
                        mg_websocket_close_handler close_handler,
                        mg_authorization_handler auth_handler,void *cbdata)

{
  mg_handler_info **ppmVar1;
  pthread_mutex_t *__mutex;
  int iVar2;
  size_t sVar3;
  mg_handler_info *pmVar4;
  size_t len;
  char *pcVar5;
  long lVar6;
  uint line;
  ulong uVar7;
  undefined8 uVar8;
  undefined1 extraout_DL;
  undefined1 extraout_DL_00;
  undefined1 extraout_DL_01;
  undefined1 extraout_DL_02;
  undefined1 uVar9;
  undefined7 extraout_var;
  undefined7 extraout_var_00;
  undefined7 extraout_var_01;
  undefined7 extraout_var_02;
  undefined7 uVar10;
  mg_handler_info **ppmVar11;
  mg_handler_info **ppmVar12;
  
  uVar7 = (ulong)(uint)handler_type;
  sVar3 = strlen(uri);
  if (handler_type == 1) {
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    if (close_handler == (mg_websocket_close_handler)0x0 &&
        ((data_handler == (mg_websocket_data_handler)0x0 &&
         ready_handler == (mg_websocket_ready_handler)0x0) &&
        (connect_handler == (mg_websocket_connect_handler)0x0 && is_delete_request == 0)) ||
        auth_handler != (mg_authorization_handler)0x0) {
      return;
    }
  }
  else if (handler_type == 2) {
    if (handler != (mg_request_handler)0x0) {
      return;
    }
    if (((connect_handler != (mg_websocket_connect_handler)0x0 ||
         ready_handler != (mg_websocket_ready_handler)0x0) ||
        data_handler != (mg_websocket_data_handler)0x0) ||
        close_handler != (mg_websocket_close_handler)0x0) {
      return;
    }
    if (is_delete_request == 0 && auth_handler == (mg_authorization_handler)0x0) {
      return;
    }
  }
  else {
    if (handler_type != 0) {
      return;
    }
    if (((connect_handler != (mg_websocket_connect_handler)0x0 ||
         ready_handler != (mg_websocket_ready_handler)0x0) ||
        data_handler != (mg_websocket_data_handler)0x0) ||
        close_handler != (mg_websocket_close_handler)0x0) {
      return;
    }
    if (handler == (mg_request_handler)0x0 && is_delete_request == 0 ||
        auth_handler != (mg_authorization_handler)0x0) {
      return;
    }
  }
  uVar8 = CONCAT71((int7)(uVar7 >> 8),
                   dom_ctx == (mg_domain_context *)0x0 || phys_ctx == (mg_context *)0x0);
  if (dom_ctx != (mg_domain_context *)0x0 && phys_ctx != (mg_context *)0x0) {
    if (phys_ctx->context_type == 1) {
      pthread_mutex_lock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
    }
    line = (uint)uVar8;
    ppmVar11 = &dom_ctx->handlers;
    ppmVar12 = ppmVar11;
    if (dom_ctx->handlers != (mg_handler_info *)0x0) {
      __mutex = &phys_ctx->nonce_mutex;
      pmVar4 = dom_ctx->handlers;
LAB_0011312b:
      do {
        if (((pmVar4->handler_type == handler_type) && (sVar3 == pmVar4->uri_len)) &&
           (iVar2 = strcmp(pmVar4->uri,uri), iVar2 == 0)) {
          if (is_delete_request == 0) {
            if (handler_type == 0) {
              if (pmVar4->refcount != 0) {
                if (phys_ctx == (mg_context *)0x0) goto LAB_0011320b;
                if (phys_ctx->context_type == 1) {
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                }
                usleep(1000);
                if (phys_ctx != (mg_context *)0x0) {
                  iVar2 = phys_ctx->context_type;
                  goto joined_r0x001131fd;
                }
                goto LAB_00113215;
              }
              lVar6 = 0x18;
            }
            else {
              lVar6 = 0x50;
              handler = auth_handler;
              if (handler_type == 1) {
                pmVar4->subprotocols = subprotocols;
                pmVar4->connect_handler = connect_handler;
                pmVar4->ready_handler = ready_handler;
                pmVar4->data_handler = data_handler;
                lVar6 = 0x40;
                handler = (mg_request_handler)close_handler;
              }
            }
            *(mg_request_handler *)((long)&pmVar4->uri + lVar6) = handler;
            pmVar4->cbdata = cbdata;
          }
          else {
            if ((handler_type == 0) && (pmVar4->refcount != 0)) {
              pmVar4->removing = 1;
              if (phys_ctx == (mg_context *)0x0) {
LAB_0011320b:
                usleep(1000);
              }
              else {
                if (phys_ctx->context_type == 1) {
                  pthread_mutex_unlock((pthread_mutex_t *)__mutex);
                }
                usleep(1000);
                if (phys_ctx != (mg_context *)0x0) {
                  iVar2 = phys_ctx->context_type;
joined_r0x001131fd:
                  if (iVar2 == 1) {
                    pthread_mutex_lock((pthread_mutex_t *)__mutex);
                  }
                }
              }
LAB_00113215:
              line = (uint)uVar8;
              pmVar4 = *ppmVar11;
              ppmVar12 = ppmVar11;
              if (pmVar4 == (mg_handler_info *)0x0) break;
              goto LAB_0011312b;
            }
            *ppmVar12 = pmVar4->next;
            free(pmVar4->uri);
            free(pmVar4);
          }
          if (phys_ctx == (mg_context *)0x0) {
            return;
          }
          if (phys_ctx->context_type != 1) {
            return;
          }
          goto LAB_00113256;
        }
        line = (uint)uVar8;
        ppmVar1 = &pmVar4->next;
        ppmVar12 = &pmVar4->next;
        pmVar4 = *ppmVar1;
      } while (*ppmVar1 != (mg_handler_info *)0x0);
    }
    if (is_delete_request == 0) {
      pmVar4 = (mg_handler_info *)calloc(1,0x68);
      if (pmVar4 == (mg_handler_info *)0x0) {
        uVar9 = extraout_DL;
        uVar10 = extraout_var;
        if ((phys_ctx != (mg_context *)0x0) && (phys_ctx->context_type == 1)) {
          pthread_mutex_unlock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
          uVar9 = extraout_DL_01;
          uVar10 = extraout_var_01;
        }
LAB_00113362:
        mg_cry_internal_wrap
                  ((mg_connection *)0x0,phys_ctx,(char *)CONCAT71(uVar10,uVar9),line,"%s",
                   "Cannot create new request handler struct, OOM");
        return;
      }
      len = strlen(uri);
      pcVar5 = mg_strndup_ctx(uri,len,(mg_context *)CONCAT71(extraout_var_00,extraout_DL_00));
      pmVar4->uri = pcVar5;
      if (pcVar5 == (char *)0x0) {
        if ((phys_ctx != (mg_context *)0x0) && (phys_ctx->context_type == 1)) {
          pthread_mutex_unlock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
        }
        free(pmVar4);
        uVar9 = extraout_DL_02;
        uVar10 = extraout_var_02;
        goto LAB_00113362;
      }
      pmVar4->uri_len = sVar3;
      if (handler_type == 0) {
        pmVar4->refcount = 0;
        pmVar4->removing = 0;
        lVar6 = 0x18;
        auth_handler = handler;
      }
      else {
        lVar6 = 0x50;
        if (handler_type == 1) {
          pmVar4->subprotocols = subprotocols;
          pmVar4->connect_handler = connect_handler;
          pmVar4->ready_handler = ready_handler;
          pmVar4->data_handler = data_handler;
          lVar6 = 0x40;
          auth_handler = (mg_authorization_handler)close_handler;
        }
      }
      *(mg_authorization_handler *)((long)&pmVar4->uri + lVar6) = auth_handler;
      pmVar4->cbdata = cbdata;
      pmVar4->handler_type = handler_type;
      pmVar4->next = (mg_handler_info *)0x0;
      *ppmVar12 = pmVar4;
    }
    if ((phys_ctx != (mg_context *)0x0) && (phys_ctx->context_type == 1)) {
LAB_00113256:
      pthread_mutex_unlock((pthread_mutex_t *)&phys_ctx->nonce_mutex);
      return;
    }
  }
  return;
}

Assistant:

static void
mg_set_handler_type(struct mg_context *phys_ctx,
                    struct mg_domain_context *dom_ctx,
                    const char *uri,
                    int handler_type,
                    int is_delete_request,
                    mg_request_handler handler,
                    struct mg_websocket_subprotocols *subprotocols,
                    mg_websocket_connect_handler connect_handler,
                    mg_websocket_ready_handler ready_handler,
                    mg_websocket_data_handler data_handler,
                    mg_websocket_close_handler close_handler,
                    mg_authorization_handler auth_handler,
                    void *cbdata)
{
	struct mg_handler_info *tmp_rh, **lastref;
	size_t urilen = strlen(uri);

	if (handler_type == WEBSOCKET_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(is_delete_request || connect_handler != NULL
		             || ready_handler != NULL || data_handler != NULL
		             || close_handler != NULL);

		DEBUG_ASSERT(auth_handler == NULL);
		if (handler != NULL) {
			return;
		}
		if (!is_delete_request && (connect_handler == NULL)
		    && (ready_handler == NULL) && (data_handler == NULL)
		    && (close_handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == REQUEST_HANDLER) {
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (handler != NULL));
		DEBUG_ASSERT(auth_handler == NULL);

		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (handler == NULL)) {
			return;
		}
		if (auth_handler != NULL) {
			return;
		}

	} else if (handler_type == AUTH_HANDLER) {
		DEBUG_ASSERT(handler == NULL);
		DEBUG_ASSERT(connect_handler == NULL && ready_handler == NULL
		             && data_handler == NULL && close_handler == NULL);
		DEBUG_ASSERT(is_delete_request || (auth_handler != NULL));
		if (handler != NULL) {
			return;
		}
		if ((connect_handler != NULL) || (ready_handler != NULL)
		    || (data_handler != NULL) || (close_handler != NULL)) {
			return;
		}
		if (!is_delete_request && (auth_handler == NULL)) {
			return;
		}
	} else {
		/* Unknown handler type. */
		return;
	}

	if (!phys_ctx || !dom_ctx) {
		/* no context available */
		return;
	}

	mg_lock_context(phys_ctx);

	/* first try to find an existing handler */
	do {
		lastref = &(dom_ctx->handlers);
		for (tmp_rh = dom_ctx->handlers; tmp_rh != NULL;
		     tmp_rh = tmp_rh->next) {
			if (tmp_rh->handler_type == handler_type
			    && (urilen == tmp_rh->uri_len) && !strcmp(tmp_rh->uri, uri)) {
				if (!is_delete_request) {
					/* update existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before updating */
						if (tmp_rh->refcount) {
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more use -> Update it */
						tmp_rh->handler = handler;
					} else if (handler_type == WEBSOCKET_HANDLER) {
						tmp_rh->subprotocols = subprotocols;
						tmp_rh->connect_handler = connect_handler;
						tmp_rh->ready_handler = ready_handler;
						tmp_rh->data_handler = data_handler;
						tmp_rh->close_handler = close_handler;
					} else { /* AUTH_HANDLER */
						tmp_rh->auth_handler = auth_handler;
					}
					tmp_rh->cbdata = cbdata;
				} else {
					/* remove existing handler */
					if (handler_type == REQUEST_HANDLER) {
						/* Wait for end of use before removing */
						if (tmp_rh->refcount) {
							tmp_rh->removing = 1;
							mg_unlock_context(phys_ctx);
							mg_sleep(1);
							mg_lock_context(phys_ctx);
							/* tmp_rh might have been freed, search again. */
							break;
						}
						/* Ok, the handler is no more used */
					}
					*lastref = tmp_rh->next;
					mg_free(tmp_rh->uri);
					mg_free(tmp_rh);
				}
				mg_unlock_context(phys_ctx);
				return;
			}
			lastref = &(tmp_rh->next);
		}
	} while (tmp_rh != NULL);

	if (is_delete_request) {
		/* no handler to set, this was a remove request to a non-existing
		 * handler */
		mg_unlock_context(phys_ctx);
		return;
	}

	tmp_rh =
	    (struct mg_handler_info *)mg_calloc_ctx(1,
	                                            sizeof(struct mg_handler_info),
	                                            phys_ctx);
	if (tmp_rh == NULL) {
		mg_unlock_context(phys_ctx);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri = mg_strdup_ctx(uri, phys_ctx);
	if (!tmp_rh->uri) {
		mg_unlock_context(phys_ctx);
		mg_free(tmp_rh);
		mg_cry_ctx_internal(phys_ctx,
		                    "%s",
		                    "Cannot create new request handler struct, OOM");
		return;
	}
	tmp_rh->uri_len = urilen;
	if (handler_type == REQUEST_HANDLER) {
		tmp_rh->refcount = 0;
		tmp_rh->removing = 0;
		tmp_rh->handler = handler;
	} else if (handler_type == WEBSOCKET_HANDLER) {
		tmp_rh->subprotocols = subprotocols;
		tmp_rh->connect_handler = connect_handler;
		tmp_rh->ready_handler = ready_handler;
		tmp_rh->data_handler = data_handler;
		tmp_rh->close_handler = close_handler;
	} else { /* AUTH_HANDLER */
		tmp_rh->auth_handler = auth_handler;
	}
	tmp_rh->cbdata = cbdata;
	tmp_rh->handler_type = handler_type;
	tmp_rh->next = NULL;

	*lastref = tmp_rh;
	mg_unlock_context(phys_ctx);
}